

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall QMainWindow::contextMenuEvent(QMainWindow *this,QContextMenuEvent *event)

{
  bool bVar1;
  int __fd;
  QMenuBar *pQVar2;
  QWidget *pQVar3;
  QRect *pos;
  QToolBar *pQVar4;
  QMenu *this_00;
  QWidget *in_RCX;
  sockaddr *__addr;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMenu *popup;
  QToolBar *tb;
  QDockWidget *dw;
  QMenuBar *mb;
  QWidget *child;
  QDockWidget *in_stack_ffffffffffffff90;
  QPoint *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar6;
  QDockWidget *in_stack_ffffffffffffffc8;
  QWidget *local_28;
  QPoint in_stack_fffffffffffffff0;
  QWidget *this_01;
  QPoint *pQVar5;
  
  this_01 = *(QWidget **)(in_FS_OFFSET + 0x28);
  QEvent::ignore(in_RSI);
  QContextMenuEvent::pos((QContextMenuEvent *)in_RSI);
  local_28 = QWidget::childAt((QWidget *)
                              CONCAT17(in_stack_ffffffffffffffaf,
                                       CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)
                                      ),in_stack_ffffffffffffffa0);
  do {
    uVar6 = local_28 != (QWidget *)0x0 && local_28 != in_RDI;
    if (local_28 == (QWidget *)0x0 || local_28 == in_RDI) {
LAB_005eb1cc:
      if ((local_28 != in_RDI) &&
         (this_00 = (QMenu *)(**(code **)(*(long *)in_RDI + 0x1a0))(), this_00 != (QMenu *)0x0)) {
        bVar1 = QMenu::isEmpty((QMenu *)in_stack_ffffffffffffffc8);
        if (bVar1) {
          if (this_00 != (QMenu *)0x0) {
            (**(code **)(*(long *)&this_00->super_QWidget + 0x20))();
          }
        }
        else {
          QWidget::setAttribute
                    (this_01,in_stack_fffffffffffffff0.yp.m_i.m_i,
                     in_stack_fffffffffffffff0.xp.m_i._3_1_);
          pQVar5 = QContextMenuEvent::globalPos((QContextMenuEvent *)in_RSI);
          __fd = (int)pQVar5;
          QMenu::popup(this_00,(QPoint *)in_RDI,
                       (QAction *)
                       CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8))
                      );
          QEvent::accept(in_RSI,__fd,__addr,(socklen_t *)in_RCX);
        }
      }
LAB_005eb268:
      if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_01) {
        return;
      }
      __stack_chk_fail();
    }
    pQVar2 = qobject_cast<QMenuBar*>((QObject *)0x5eb0a6);
    if (pQVar2 != (QMenuBar *)0x0) {
      in_RCX = in_RDI;
      pQVar3 = QWidget::parentWidget((QWidget *)0x5eb0bd);
      in_RDI = in_RCX;
      if (pQVar3 != in_RCX) goto LAB_005eb268;
      goto LAB_005eb1cc;
    }
    in_stack_ffffffffffffffc8 = qobject_cast<QDockWidget*>((QObject *)0x5eb0db);
    if (in_stack_ffffffffffffffc8 != (QDockWidget *)0x0) {
      pQVar3 = QWidget::parentWidget((QWidget *)0x5eb0f6);
      if (pQVar3 != in_RDI) goto LAB_005eb268;
      in_RCX = QDockWidget::widget(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffae = 0;
      if (in_RCX != (QWidget *)0x0) {
        pQVar3 = QDockWidget::widget(in_stack_ffffffffffffff90);
        pos = QWidget::geometry(pQVar3);
        QContextMenuEvent::pos((QContextMenuEvent *)in_RSI);
        in_stack_fffffffffffffff0 =
             QWidget::mapFrom(in_RDI,(QWidget *)
                                     CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffae,
                                                             in_stack_ffffffffffffffa8)),
                              (QPoint *)pos);
        in_stack_ffffffffffffffae = QRect::contains((QPoint *)pos,true);
      }
      if ((in_stack_ffffffffffffffae & 1) != 0) goto LAB_005eb268;
      goto LAB_005eb1cc;
    }
    pQVar4 = qobject_cast<QToolBar*>((QObject *)0x5eb190);
    if (pQVar4 != (QToolBar *)0x0) {
      in_RCX = in_RDI;
      pQVar3 = QWidget::parentWidget((QWidget *)0x5eb1a7);
      in_RDI = in_RCX;
      if (pQVar3 != in_RCX) goto LAB_005eb268;
      goto LAB_005eb1cc;
    }
    local_28 = QWidget::parentWidget((QWidget *)0x5eb1c2);
  } while( true );
}

Assistant:

void QMainWindow::contextMenuEvent(QContextMenuEvent *event)
{
    event->ignore();
    // only show the context menu for direct QDockWidget and QToolBar
    // children and for the menu bar as well
    QWidget *child = childAt(event->pos());
    while (child && child != this) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar *>(child)) {
            if (mb->parentWidget() != this)
                return;
            break;
        }
#endif
#if QT_CONFIG(dockwidget)
        if (QDockWidget *dw = qobject_cast<QDockWidget *>(child)) {
            if (dw->parentWidget() != this)
                return;
            if (dw->widget()
                && dw->widget()->geometry().contains(child->mapFrom(this, event->pos()))) {
                // ignore the event if the mouse is over the QDockWidget contents
                return;
            }
            break;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar *>(child)) {
            if (tb->parentWidget() != this)
                return;
            break;
        }
#endif
        child = child->parentWidget();
    }
    if (child == this)
        return;

#if QT_CONFIG(menu)
    QMenu *popup = createPopupMenu();
    if (popup) {
        if (!popup->isEmpty()) {
            popup->setAttribute(Qt::WA_DeleteOnClose);
            popup->popup(event->globalPos());
            event->accept();
        } else {
            delete popup;
        }
    }
#endif
}